

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
          (DescriptorsByNameEq<google::protobuf::Descriptor> *this,Descriptor *lhs,Descriptor *rhs)

{
  string_view __x;
  string_view __y;
  undefined1 local_41;
  Descriptor *rhs_local;
  Descriptor *lhs_local;
  DescriptorsByNameEq<google::protobuf::Descriptor> *this_local;
  
  local_41 = true;
  if (lhs != rhs) {
    __x = Descriptor::name(lhs);
    __y = Descriptor::name(rhs);
    local_41 = std::operator==(__x,__y);
  }
  return local_41;
}

Assistant:

bool operator()(const DescriptorT* lhs, const DescriptorT* rhs) const {
    return lhs == rhs || lhs->name() == rhs->name();
  }